

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_embedded_file.cpp
# Opt level: O0

ON__UINT64 __thiscall ON_Buffer::Read(ON_Buffer *this,ON__UINT64 size,void *buffer)

{
  bool bVar1;
  ulong local_58;
  void *local_48;
  ON__UINT64 sz;
  ON__UINT64 offset;
  ON__UINT64 pos1;
  ON__UINT64 rc;
  void *buffer_local;
  ON__UINT64 size_local;
  ON_Buffer *this_local;
  
  if (size == 0) {
    this_local = (ON_Buffer *)0x0;
  }
  else if (buffer == (void *)0x0) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_embedded_file.cpp"
               ,0x465,"","size parameter > 0 and buffer parameter is null.");
    this_local = (ON_Buffer *)0x0;
  }
  else if (this->m_current_position < this->m_buffer_size) {
    bVar1 = SetCurrentSegment(this,false);
    if (bVar1) {
      pos1 = 0;
      rc = (ON__UINT64)buffer;
      buffer_local = (void *)size;
      while (buffer_local != (void *)0x0) {
        if ((this->m_current_segment == (ON_BUFFER_SEGMENT *)0x0) ||
           (this->m_current_segment->m_segment_buffer == (uchar *)0x0)) {
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_embedded_file.cpp"
                     ,0x482,"","Corrupt ON_Buffer");
          return 0;
        }
        if (this->m_buffer_size < this->m_current_segment->m_segment_position1) {
          local_58 = this->m_buffer_size;
        }
        else {
          local_58 = this->m_current_segment->m_segment_position1;
        }
        if ((this->m_current_position < this->m_current_segment->m_segment_position0) ||
           (local_58 <= this->m_current_position)) {
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_embedded_file.cpp"
                     ,0x48c,"","Corrupt ON_Buffer");
          return 0;
        }
        local_48 = (void *)(local_58 - this->m_current_position);
        if (buffer_local < local_48) {
          local_48 = buffer_local;
        }
        memcpy((void *)rc,
               this->m_current_segment->m_segment_buffer +
               (this->m_current_position - this->m_current_segment->m_segment_position0),
               (size_t)local_48);
        this->m_current_position = (long)local_48 + this->m_current_position;
        pos1 = (long)local_48 + pos1;
        buffer_local = (void *)((long)buffer_local - (long)local_48);
        rc = rc + (long)local_48;
        if (buffer_local != (void *)0x0) {
          if ((this->m_current_position == this->m_buffer_size) &&
             (this->m_current_segment == this->m_last_segment)) break;
          this->m_current_segment = this->m_current_segment->m_next_segment;
        }
      }
      this_local = (ON_Buffer *)pos1;
    }
    else {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_embedded_file.cpp"
                 ,0x479,"","Corrupt ON_Buffer");
      this_local = (ON_Buffer *)0x0;
    }
  }
  else {
    if (this->m_buffer_size < this->m_current_position) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_embedded_file.cpp"
                 ,0x472,"","Read attempted when current position > buffer size.");
    }
    this_local = (ON_Buffer *)0x0;
  }
  return (ON__UINT64)this_local;
}

Assistant:

ON__UINT64 ON_Buffer::Read( ON__UINT64 size, void* buffer )
{
  if ( 0 == size )
  {
    // not an error condition
    return 0;
  }

  if ( 0 == buffer )
  {
    // ON_Buffer error
    ON_ERROR("size parameter > 0 and buffer parameter is null.");
    return 0;
  }

  if ( m_current_position >= m_buffer_size )
  {
    // m_current_position == m_buffer_size is a common situation
    // and is not an error condition.
    // For example, it occurs when a previous Read() read up to the
    // end of the buffer and the caller is testing the number of 
    // bytes read to detect the end of buffer condition.
    if ( m_current_position > m_buffer_size )
    {
      ON_ERROR("Read attempted when current position > buffer size.");
    }
    return 0;
  }

  if ( !SetCurrentSegment(false) )
  {
    ON_ERROR("Corrupt ON_Buffer");
    return 0;
  }

  ON__UINT64 rc = 0;
  while ( size > 0 )
  {
    if( 0 == m_current_segment || 0 == m_current_segment->m_segment_buffer )
    {
      ON_ERROR("Corrupt ON_Buffer");
      return 0;
    }

    // set pos1 to the maximum position to be read from m_current_segment.
    ON__UINT64 pos1 = (m_buffer_size < m_current_segment->m_segment_position1)
                    ? m_buffer_size
                    : m_current_segment->m_segment_position1;
    if ( m_current_position < m_current_segment->m_segment_position0 || m_current_position >= pos1 )
    {
      ON_ERROR("Corrupt ON_Buffer");
      return 0;
    }

    ON__UINT64 offset = m_current_position - m_current_segment->m_segment_position0;           
    ON__UINT64 sz = pos1 - m_current_position;

    if ( sz > size )
      sz = size;
    memcpy( buffer, m_current_segment->m_segment_buffer + offset, (size_t)sz );
    m_current_position += sz;
    rc += sz;
    size -= sz;
    buffer = ((unsigned char*)buffer) + sz;
    if ( size > 0 )
    {
      if ( m_current_position == m_buffer_size && m_current_segment == m_last_segment )
      {
        // This is a common situation that occurs when the read request is for a
        // size larger than the remaining number of bytes in the buffer. For example,
        // when repeatedly reading into a fixed size buffer until reaching the end
        // of the file. This is not an error condition.
        break;
      }
      m_current_segment = m_current_segment->m_next_segment;
    }
  }

  return rc;
}